

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

uint8_t parse_memtm_mapping_entry_11(uint16_t pos,uint16_t len,uint16_t hdr_pos)

{
  uint8_t local_9;
  uint16_t hdr_pos_local;
  uint16_t len_local;
  uint16_t pos_local;
  
  if (len < 4) {
    printf("Unknown timing mapping entry length: %u\n",(ulong)len);
    local_9 = 0xff;
  }
  else {
    if (bios->data[(int)(uint)pos] == 0xff) {
      printf(" Timing entry: none/boot\n");
    }
    else {
      printf(" Timing entry: %u\n",(ulong)bios->data[pos]);
    }
    local_9 = bios->data[pos];
  }
  return local_9;
}

Assistant:

uint8_t parse_memtm_mapping_entry_11(uint16_t pos, uint16_t len, uint16_t hdr_pos)
{
	if(len < 4) {
		printf("Unknown timing mapping entry length: %u\n", len);
		return 0xff;
	}
	if(bios->data[pos+0] != 0xff) {
		printf(" Timing entry: %u\n", bios->data[pos]);
	} else {
		printf(" Timing entry: none/boot\n");
	}

	return bios->data[pos];
}